

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O0

void __thiscall spdlog::details::backtracer::backtracer(backtracer *this,backtracer *other)

{
  bool __i;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  backtracer *other_local;
  backtracer *this_local;
  
  lock._M_device = &other->mutex_;
  std::mutex::mutex(&this->mutex_);
  std::atomic<bool>::atomic(&this->enabled_,false);
  circular_q<spdlog::details::log_msg_buffer>::circular_q(&this->messages_);
  std::lock_guard<std::mutex>::lock_guard(&local_20,lock._M_device);
  __i = enabled((backtracer *)lock._M_device);
  std::atomic<bool>::operator=(&this->enabled_,__i);
  circular_q<spdlog::details::log_msg_buffer>::operator=
            (&this->messages_,
             (circular_q<spdlog::details::log_msg_buffer> *)
             ((long)&lock._M_device[1].super___mutex_base._M_mutex + 8));
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

SPDLOG_INLINE backtracer::backtracer(const backtracer &other)
{
    std::lock_guard<std::mutex> lock(other.mutex_);
    enabled_ = other.enabled();
    messages_ = other.messages_;
}